

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void __thiscall pstore::file::file_handle::file_handle(file_handle *this,file_handle *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_file_base)._vptr_file_base = (_func_int **)&PTR__file_handle_001338c8;
  paVar1 = &(this->path_).field_2;
  (this->path_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (other->path_)._M_dataplus._M_p;
  paVar2 = &(other->path_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(other->path_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->path_).field_2 + 8) = uVar4;
  }
  else {
    (this->path_)._M_dataplus._M_p = pcVar3;
    (this->path_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->path_)._M_string_length = (other->path_)._M_string_length;
  (other->path_)._M_dataplus._M_p = (pointer)paVar2;
  (other->path_)._M_string_length = 0;
  (other->path_).field_2._M_local_buf[0] = '\0';
  this->file_ = other->file_;
  this->is_writable_ = other->is_writable_;
  other->file_ = -1;
  other->is_writable_ = false;
  return;
}

Assistant:

file_handle::file_handle (file_handle && other) noexcept
                : path_{std::move (other.path_)}
                , file_{other.file_}
                , is_writable_{other.is_writable_} {

            other.file_ = invalid_oshandle;
            other.is_writable_ = false;
        }